

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::clear(SPxSolverBase<double> *this)

{
  std::vector<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>::
  resize(&(this->unitVecs).data,0);
  VectorBase<double>::clear(&this->dualRhs);
  UpdateVector<double>::clear(&this->dualVec);
  VectorBase<double>::clear(&this->primRhs);
  UpdateVector<double>::clear(&this->primVec);
  UpdateVector<double>::clear(&this->addVec);
  VectorBase<double>::clear(&this->theURbound);
  VectorBase<double>::clear(&this->theLRbound);
  VectorBase<double>::clear(&this->theUCbound);
  VectorBase<double>::clear(&this->theLCbound);
  VectorBase<double>::clear(&this->theTest);
  VectorBase<double>::clear(&this->theCoTest);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  SPxLPBase<double>::clear(&this->super_SPxLPBase<double>);
  setBasisStatus(this,NO_PROBLEM);
  if ((this->super_SPxBasisBase<double>).theLP != (SPxSolverBase<double> *)0x0) {
    SPxBasisBase<double>::reDim(&this->super_SPxBasisBase<double>);
  }
  (this->infeasibilities).super_IdxSet.num = 0;
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  (this->isInfeasible).thesize = 0;
  (this->isInfeasibleCo).thesize = 0;
  return;
}

Assistant:

void SPxSolverBase<R>::clear()
   {
      unitVecs.reSize(0);

      dualRhs.clear();
      dualVec.clear();
      primRhs.clear();
      primVec.clear();
      addVec.clear();
      theURbound.clear();
      theLRbound.clear();
      theUCbound.clear();
      theLCbound.clear();
      theTest.clear();
      theCoTest.clear();

      forceRecompNonbasicValue();
      unInit();
      SPxLPBase<R>::clear();
      setBasisStatus(SPxBasisBase<R>::NO_PROBLEM);

      // clear the basis only when theLP is present, because LP data (nrows, ncols) is used in reDim()
      if(this->theLP != nullptr)
         SPxBasisBase<R>::reDim();

      infeasibilities.clear();
      infeasibilitiesCo.clear();
      isInfeasible.clear();
      isInfeasibleCo.clear();
   }